

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O2

int match_pattern(char *tp,char *pp)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  char *psp;
  char *tsp;
  char *pcVar5;
  char *pcVar6;
  
  bVar4 = false;
  pcVar5 = tp;
  pcVar6 = pp;
  do {
    cVar2 = *pp;
    if (cVar2 == '*') {
      while (cVar2 == '*') {
        pcVar6 = pp + 1;
        pp = pp + 1;
        cVar2 = *pcVar6;
      }
      if (cVar2 == '\0') {
        return 1;
      }
      tp = pcVar5 + -1;
      do {
        cVar3 = tp[1];
        tp = tp + 1;
        if (cVar3 == cVar2) break;
      } while (cVar3 != '\0');
      pcVar5 = tp;
      pcVar6 = pp;
      bVar4 = true;
      if (cVar3 == '\0') {
        return 0;
      }
    }
    else {
      if (cVar2 == '\0') {
        return (int)(*pcVar5 == '\0');
      }
      if (*pcVar5 != cVar2) {
        if (!bVar4) {
          return 0;
        }
        do {
          pcVar1 = tp + 1;
          if (*pcVar1 == '\0') {
            return 0;
          }
          tp = tp + 1;
          pp = pcVar6;
          pcVar5 = tp;
          bVar4 = true;
        } while (*pcVar1 != *pcVar6);
      }
    }
    pcVar5 = pcVar5 + 1;
    pp = pp + 1;
  } while( true );
}

Assistant:

int match_pattern(char *tp, char *pp)
{
  char *tsp, *psp;
  int inastr;

#ifdef DOS
  /* % is not allowed in DOS names for Medley. */
  if (strchr(tp, '%')) return 0;

#endif /* DOS */

  for (tsp = tp, psp = pp, inastr = 0;; tp++, pp++) {
    switch (*pp) {
      case '\0': return ((*tp == '\0') ? 1 : 0);

      case '*':
        while (*pp == '*') pp++; /* Skip successive '*'s. */
        if (*pp == '\0') return (1);

        psp = pp;
        while (*tp != *pp && *tp != '\0') tp++;

        if (*tp == '\0') return (0);

        tsp = tp;
        inastr = 1;

        continue;

      default:
        if (*tp == *pp) continue;

        if (inastr) {
          /*
           * Try to find a character which match to
           * a character psp points from a character
           * next to tsp.  If found retry from there.
           */
          for (tp = tsp + 1; *tp != '\0' && *tp != *psp; tp++) {}
          if (*tp == '\0') return (0);
          pp = psp;
          tsp = tp;
          continue;
        } else {
          return (0);
        }
    }
  }
}